

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O2

CURLcode Curl_buffer_send(dynbuf *in,Curl_easy *data,curl_off_t *bytes_written,
                         curl_off_t included_body_bytes,int socketindex)

{
  curl_socket_t sockfd;
  connectdata *pcVar1;
  char *pcVar2;
  void *pvVar3;
  ssize_t sVar4;
  CURLcode CVar5;
  char *pcVar6;
  size_t sVar7;
  ulong uVar8;
  char *pcVar9;
  ulong uVar10;
  long lVar11;
  size_t sVar12;
  long lVar13;
  ulong uVar14;
  ssize_t amount;
  anon_union_8_12_57927972_for_p local_40;
  long *local_38;
  
  pcVar1 = data->conn;
  local_40 = (data->req).p;
  sockfd = pcVar1->sock[socketindex];
  local_38 = bytes_written;
  pcVar6 = Curl_dyn_ptr(in);
  sVar7 = Curl_dyn_len(in);
  uVar14 = sVar7 - included_body_bytes;
  if ((((pcVar1->handler->flags & 1) == 0) && ((pcVar1->http_proxy).proxytype != '\x02')) ||
     (pcVar1->httpversion == '\x14')) {
    lVar13 = (data->set).max_send_speed;
    uVar10 = uVar14 + lVar13;
    if (included_body_bytes <= lVar13) {
      uVar10 = sVar7;
    }
    if (lVar13 == 0) {
      uVar10 = sVar7;
    }
  }
  else {
    lVar13 = (data->set).max_send_speed;
    CVar5 = Curl_get_upload_buffer(data);
    if (CVar5 != CURLE_OK) {
      Curl_dyn_free(in);
      return CVar5;
    }
    lVar11 = 0;
    if (lVar13 < included_body_bytes) {
      lVar11 = lVar13 - included_body_bytes;
    }
    if (lVar13 == 0) {
      lVar11 = 0;
    }
    uVar8 = (ulong)(data->set).upload_buffer_size;
    uVar10 = lVar11 + sVar7;
    if (uVar8 <= lVar11 + sVar7) {
      uVar10 = uVar8;
    }
    memcpy((data->state).ulbuf,pcVar6,uVar10);
    pcVar6 = (data->state).ulbuf;
  }
  CVar5 = Curl_write(data,sockfd,pcVar6,uVar10,&amount);
  sVar4 = amount;
  if (CVar5 == CURLE_OK) {
    uVar10 = uVar14;
    if ((ulong)amount < uVar14) {
      uVar10 = amount;
    }
    sVar12 = amount - uVar10;
    Curl_debug(data,CURLINFO_HEADER_OUT,pcVar6,uVar10);
    if (uVar14 < (ulong)sVar4) {
      Curl_debug(data,CURLINFO_DATA_OUT,pcVar6 + uVar10,sVar12);
    }
    *local_38 = *local_38 + amount;
    if (local_40.file == (FILEPROTO *)0x0) {
      if (amount != sVar7) {
        return CURLE_SEND_ERROR;
      }
    }
    else {
      lVar13 = sVar12 + (data->req).writebytecount;
      (data->req).writebytecount = lVar13;
      Curl_pgrsSetUploadCounter(data,lVar13);
      pcVar6 = (char *)(sVar7 - amount);
      if (pcVar6 != (char *)0x0) {
        pcVar9 = Curl_dyn_ptr(in);
        pvVar3 = (data->state).in;
        ((local_40.http)->backup).fread_func = (data->state).fread_func;
        ((local_40.http)->backup).fread_in = pvVar3;
        pcVar2 = (local_40.file)->freepath;
        ((local_40.http)->backup).postdata = (local_40.http)->postdata;
        ((local_40.http)->backup).postsize = (curl_off_t)pcVar2;
        (data->state).fread_func = readmoredata;
        (data->state).in = data;
        (local_40.http)->postdata = pcVar9 + amount;
        (local_40.file)->freepath = pcVar6;
        (data->req).pendingheader = uVar14 - uVar10;
        pcVar6 = in->bufr;
        sVar7 = in->leng;
        sVar12 = in->toobig;
        ((local_40.http)->send_buffer).allc = in->allc;
        ((local_40.http)->send_buffer).toobig = sVar12;
        ((local_40.http)->send_buffer).bufr = pcVar6;
        ((local_40.http)->send_buffer).leng = sVar7;
        (local_40.http)->sending = HTTPSEND_REQUEST;
        return CURLE_OK;
      }
      (local_40.http)->sending = HTTPSEND_BODY;
    }
  }
  Curl_dyn_free(in);
  (data->req).pendingheader = 0;
  return CVar5;
}

Assistant:

CURLcode Curl_buffer_send(struct dynbuf *in,
                          struct Curl_easy *data,
                          /* add the number of sent bytes to this
                             counter */
                          curl_off_t *bytes_written,
                          /* how much of the buffer contains body data */
                          curl_off_t included_body_bytes,
                          int socketindex)
{
  ssize_t amount;
  CURLcode result;
  char *ptr;
  size_t size;
  struct connectdata *conn = data->conn;
  struct HTTP *http = data->req.p.http;
  size_t sendsize;
  curl_socket_t sockfd;
  size_t headersize;

  DEBUGASSERT(socketindex <= SECONDARYSOCKET);

  sockfd = conn->sock[socketindex];

  /* The looping below is required since we use non-blocking sockets, but due
     to the circumstances we will just loop and try again and again etc */

  ptr = Curl_dyn_ptr(in);
  size = Curl_dyn_len(in);

  headersize = size - (size_t)included_body_bytes; /* the initial part that
                                                      isn't body is header */

  DEBUGASSERT(size > (size_t)included_body_bytes);

  if((conn->handler->flags & PROTOPT_SSL
#ifndef CURL_DISABLE_PROXY
      || conn->http_proxy.proxytype == CURLPROXY_HTTPS
#endif
       )
     && conn->httpversion != 20) {
    /* Make sure this doesn't send more body bytes than what the max send
       speed says. The request bytes do not count to the max speed.
    */
    if(data->set.max_send_speed &&
       (included_body_bytes > data->set.max_send_speed)) {
      curl_off_t overflow = included_body_bytes - data->set.max_send_speed;
      DEBUGASSERT((size_t)overflow < size);
      sendsize = size - (size_t)overflow;
    }
    else
      sendsize = size;

    /* OpenSSL is very picky and we must send the SAME buffer pointer to the
       library when we attempt to re-send this buffer. Sending the same data
       is not enough, we must use the exact same address. For this reason, we
       must copy the data to the uploadbuffer first, since that is the buffer
       we will be using if this send is retried later.
    */
    result = Curl_get_upload_buffer(data);
    if(result) {
      /* malloc failed, free memory and return to the caller */
      Curl_dyn_free(in);
      return result;
    }
    /* We never send more than upload_buffer_size bytes in one single chunk
       when we speak HTTPS, as if only a fraction of it is sent now, this data
       needs to fit into the normal read-callback buffer later on and that
       buffer is using this size.
    */
    if(sendsize > (size_t)data->set.upload_buffer_size)
      sendsize = (size_t)data->set.upload_buffer_size;

    memcpy(data->state.ulbuf, ptr, sendsize);
    ptr = data->state.ulbuf;
  }
  else {
#ifdef CURLDEBUG
    /* Allow debug builds to override this logic to force short initial
       sends
     */
    char *p = getenv("CURL_SMALLREQSEND");
    if(p) {
      size_t altsize = (size_t)strtoul(p, NULL, 10);
      if(altsize)
        sendsize = CURLMIN(size, altsize);
      else
        sendsize = size;
    }
    else
#endif
    {
      /* Make sure this doesn't send more body bytes than what the max send
         speed says. The request bytes do not count to the max speed.
      */
      if(data->set.max_send_speed &&
         (included_body_bytes > data->set.max_send_speed)) {
        curl_off_t overflow = included_body_bytes - data->set.max_send_speed;
        DEBUGASSERT((size_t)overflow < size);
        sendsize = size - (size_t)overflow;
      }
      else
        sendsize = size;
    }
  }

  result = Curl_write(data, sockfd, ptr, sendsize, &amount);

  if(!result) {
    /*
     * Note that we may not send the entire chunk at once, and we have a set
     * number of data bytes at the end of the big buffer (out of which we may
     * only send away a part).
     */
    /* how much of the header that was sent */
    size_t headlen = (size_t)amount>headersize ? headersize : (size_t)amount;
    size_t bodylen = amount - headlen;

    /* this data _may_ contain binary stuff */
    Curl_debug(data, CURLINFO_HEADER_OUT, ptr, headlen);
    if(bodylen)
      /* there was body data sent beyond the initial header part, pass that on
         to the debug callback too */
      Curl_debug(data, CURLINFO_DATA_OUT, ptr + headlen, bodylen);

    /* 'amount' can never be a very large value here so typecasting it so a
       signed 31 bit value should not cause problems even if ssize_t is
       64bit */
    *bytes_written += (long)amount;

    if(http) {
      /* if we sent a piece of the body here, up the byte counter for it
         accordingly */
      data->req.writebytecount += bodylen;
      Curl_pgrsSetUploadCounter(data, data->req.writebytecount);

      if((size_t)amount != size) {
        /* The whole request could not be sent in one system call. We must
           queue it up and send it later when we get the chance. We must not
           loop here and wait until it might work again. */

        size -= amount;

        ptr = Curl_dyn_ptr(in) + amount;

        /* backup the currently set pointers */
        http->backup.fread_func = data->state.fread_func;
        http->backup.fread_in = data->state.in;
        http->backup.postdata = http->postdata;
        http->backup.postsize = http->postsize;

        /* set the new pointers for the request-sending */
        data->state.fread_func = (curl_read_callback)readmoredata;
        data->state.in = (void *)data;
        http->postdata = ptr;
        http->postsize = (curl_off_t)size;

        /* this much data is remaining header: */
        data->req.pendingheader = headersize - headlen;

        http->send_buffer = *in; /* copy the whole struct */
        http->sending = HTTPSEND_REQUEST;

        return CURLE_OK;
      }
      http->sending = HTTPSEND_BODY;
      /* the full buffer was sent, clean up and return */
    }
    else {
      if((size_t)amount != size)
        /* We have no continue-send mechanism now, fail. This can only happen
           when this function is used from the CONNECT sending function. We
           currently (stupidly) assume that the whole request is always sent
           away in the first single chunk.

           This needs FIXing.
        */
        return CURLE_SEND_ERROR;
    }
  }
  Curl_dyn_free(in);

  /* no remaining header data */
  data->req.pendingheader = 0;
  return result;
}